

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astTupleWithLookupStartingFromNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  undefined8 uVar3;
  anon_struct_24_3_484e24cd gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_78;
  ulong uStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  uStack_70 = 0;
  uVar3 = 0;
  local_68 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 3;
  local_30 = (undefined1 *)&local_78;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_78 = sysbvm_context_shallowCopy(context,*arguments);
  sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_78 + 0x18) = sVar2;
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(local_78 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  uStack_70 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,*(sysbvm_tuple_t *)(local_78 + 0x28),0,arguments[1]);
  *(ulong *)(local_78 + 0x28) = uStack_70;
  local_68 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                       (context,*(sysbvm_tuple_t *)(local_78 + 0x30),(context->roots).typeType,
                        arguments[1]);
  *(sysbvm_tuple_t *)(local_78 + 0x30) = local_68;
  if ((uStack_70 & 0xf) == 0 && uStack_70 != 0) {
    uVar3 = *(undefined8 *)(uStack_70 + 0x20);
  }
  *(undefined8 *)(local_78 + 0x20) = uVar3;
  _Var1 = sysbvm_astNode_isLiteralNode(context,local_68);
  if (_Var1) {
    sVar2 = sysbvm_astLiteralNode_getValue(local_68);
    *(sysbvm_tuple_t *)(local_78 + 0x20) = sVar2;
  }
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return local_78;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleWithLookupStartingFromNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astTupleWithLookupStartingFromNode_t *objectWithLookupStartingFromNode;
        sysbvm_tuple_t analyzedObjectExpression;
        sysbvm_tuple_t analyzedTypeExpression;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.objectWithLookupStartingFromNode = (sysbvm_astTupleWithLookupStartingFromNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.objectWithLookupStartingFromNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.objectWithLookupStartingFromNode->super.sourcePosition);

    gcFrame.analyzedObjectExpression = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.objectWithLookupStartingFromNode->tupleExpression, *environment);
    gcFrame.objectWithLookupStartingFromNode->tupleExpression = gcFrame.analyzedObjectExpression;

    gcFrame.analyzedTypeExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.objectWithLookupStartingFromNode->typeExpression, context->roots.typeType, *environment);
    gcFrame.objectWithLookupStartingFromNode->typeExpression = gcFrame.analyzedTypeExpression;

    gcFrame.objectWithLookupStartingFromNode->super.analyzedType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedObjectExpression);
    if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedTypeExpression))
        gcFrame.objectWithLookupStartingFromNode->super.analyzedType = sysbvm_astLiteralNode_getValue(gcFrame.analyzedTypeExpression);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.objectWithLookupStartingFromNode;
}